

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void __thiscall HACD::MemMutex::MemMutex(MemMutex *this)

{
  pthread_mutexattr_t mta;
  pthread_mutexattr_t local_14;
  
  pthread_mutexattr_init(&local_14);
  pthread_mutexattr_settype(&local_14,1);
  pthread_mutex_init((pthread_mutex_t *)this,&local_14);
  pthread_mutexattr_destroy(&local_14);
  return;
}

Assistant:

MemMutex::MemMutex(void)
{
#if defined(_WIN32) || defined(_XBOX)
	InitializeCriticalSection(&m_Mutex);
#elif defined(__APPLE__) || defined(__linux__)
	pthread_mutexattr_t mta;
	pthread_mutexattr_init(&mta);
	pthread_mutexattr_settype(&mta, PTHREAD_MUTEX_RECURSIVE);
	pthread_mutex_init(&m_Mutex, &mta);
	pthread_mutexattr_destroy(&mta);
#endif
}